

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

int set_opaque_attr(attr_list list,atom_t attr_id,int length,char *buffer)

{
  int iVar1;
  attr_union value;
  attr_union value_00;
  
  value.u.o.buffer = buffer;
  value.u.l = CONCAT44(0,length);
  iVar1 = replace_pattr(list,attr_id,Attr_String,value);
  if (iVar1 == 0) {
    value_00.u.o.buffer = buffer;
    value_00.u.l = CONCAT44(0,length);
    add_pattr(list,attr_id,Attr_String,value_00);
  }
  return 1;
}

Assistant:

extern int 
set_opaque_attr(attr_list list, atom_t attr_id, int length, char *buffer)
{
    attr_union value;
    value.u.o.length = length;
    value.u.o.buffer = buffer;
    if (replace_pattr(list, attr_id, Attr_String, value) == 0) {
	return add_pattr(list, attr_id, Attr_String, value);
    }
    return 1;
}